

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int gen_publickey_from_dsa_openssh_priv_data
              (LIBSSH2_SESSION *session,string_buf *decrypted,uchar **method,size_t *method_len,
              uchar **pubkeydata,size_t *pubkeydata_len,EVP_PKEY **dsa_ctx)

{
  int iVar1;
  EVP_PKEY *pk;
  EVP_PKEY *dsa;
  uchar *priv_key;
  uchar *pub_key;
  uchar *g;
  uchar *q;
  uchar *p;
  size_t priv_len;
  size_t pub_len;
  size_t glen;
  size_t qlen;
  size_t plen;
  size_t *psStack_50;
  int rc;
  size_t *pubkeydata_len_local;
  uchar **pubkeydata_local;
  size_t *method_len_local;
  uchar **method_local;
  string_buf *decrypted_local;
  LIBSSH2_SESSION *session_local;
  
  plen._4_4_ = 0;
  pk = (EVP_PKEY *)0x0;
  psStack_50 = pubkeydata_len;
  pubkeydata_len_local = (size_t *)pubkeydata;
  pubkeydata_local = (uchar **)method_len;
  method_len_local = (size_t *)method;
  method_local = &decrypted->data;
  decrypted_local = (string_buf *)session;
  iVar1 = _libssh2_get_bignum_bytes(decrypted,&q,&qlen);
  if (iVar1 == 0) {
    iVar1 = _libssh2_get_bignum_bytes((string_buf *)method_local,&g,&glen);
    if (iVar1 == 0) {
      iVar1 = _libssh2_get_bignum_bytes((string_buf *)method_local,&pub_key,&pub_len);
      if (iVar1 == 0) {
        iVar1 = _libssh2_get_bignum_bytes((string_buf *)method_local,&priv_key,&priv_len);
        if (iVar1 == 0) {
          iVar1 = _libssh2_get_bignum_bytes((string_buf *)method_local,(uchar **)&dsa,(size_t *)&p);
          if (iVar1 == 0) {
            plen._4_4_ = _libssh2_dsa_new(&pk,q,qlen,g,glen,pub_key,pub_len,priv_key,priv_len,
                                          (uchar *)dsa,(unsigned_long)p);
            if (plen._4_4_ == 0) {
              iVar1 = 0;
              if (((pk != (EVP_PKEY *)0x0) && (pubkeydata_len_local != (size_t *)0x0)) &&
                 (method_len_local != (size_t *)0x0)) {
                iVar1 = gen_publickey_from_dsa_evp
                                  ((LIBSSH2_SESSION *)decrypted_local,(uchar **)method_len_local,
                                   (size_t *)pubkeydata_local,(uchar **)pubkeydata_len_local,
                                   psStack_50,pk);
              }
              plen._4_4_ = iVar1;
              if (dsa_ctx == (EVP_PKEY **)0x0) {
                EVP_PKEY_free((EVP_PKEY *)pk);
              }
              else {
                *dsa_ctx = pk;
              }
              session_local._4_4_ = plen._4_4_;
            }
            else {
              if (pk != (EVP_PKEY *)0x0) {
                EVP_PKEY_free((EVP_PKEY *)pk);
              }
              session_local._4_4_ =
                   _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-6,
                                  "Unable to allocate memory for private key data");
            }
          }
          else {
            _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"DSA no private key");
            session_local._4_4_ = -1;
          }
        }
        else {
          _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"DSA no public key");
          session_local._4_4_ = -1;
        }
      }
      else {
        _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"DSA no g");
        session_local._4_4_ = -1;
      }
    }
    else {
      _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"DSA no q");
      session_local._4_4_ = -1;
    }
  }
  else {
    _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"DSA no p");
    session_local._4_4_ = -1;
  }
  return session_local._4_4_;
}

Assistant:

static int
gen_publickey_from_dsa_openssh_priv_data(LIBSSH2_SESSION *session,
                                         struct string_buf *decrypted,
                                         unsigned char **method,
                                         size_t *method_len,
                                         unsigned char **pubkeydata,
                                         size_t *pubkeydata_len,
                                         libssh2_dsa_ctx **dsa_ctx)
{
    int rc = 0;
    size_t plen, qlen, glen, pub_len, priv_len;
    unsigned char *p, *q, *g, *pub_key, *priv_key;
    libssh2_dsa_ctx *dsa = NULL;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing DSA keys from private key data"));

    if(_libssh2_get_bignum_bytes(decrypted, &p, &plen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "DSA no p");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &q, &qlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "DSA no q");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &g, &glen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "DSA no g");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &pub_key, &pub_len)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "DSA no public key");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &priv_key, &priv_len)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "DSA no private key");
        return -1;
    }

    rc = _libssh2_dsa_new(&dsa,
                          p, (unsigned long)plen,
                          q, (unsigned long)qlen,
                          g, (unsigned long)glen,
                          pub_key, (unsigned long)pub_len,
                          priv_key, (unsigned long)priv_len);
    if(rc) {
        _libssh2_debug((session,
                       LIBSSH2_ERROR_PROTO,
                       "Could not create DSA private key"));
        goto fail;
    }

    if(dsa && pubkeydata && method) {
#ifdef USE_OPENSSL_3
        EVP_PKEY *pk = dsa;
#else
        EVP_PKEY *pk = EVP_PKEY_new();
        EVP_PKEY_set1_DSA(pk, dsa);
#endif

        rc = gen_publickey_from_dsa_evp(session, method, method_len,
                                        pubkeydata, pubkeydata_len,
                                        pk);

#ifndef USE_OPENSSL_3
        if(pk)
            EVP_PKEY_free(pk);
#endif
    }

    if(dsa_ctx)
        *dsa_ctx = dsa;
    else
        _libssh2_dsa_free(dsa);

    return rc;

fail:

    if(dsa)
        _libssh2_dsa_free(dsa);

    return _libssh2_error(session,
                          LIBSSH2_ERROR_ALLOC,
                          "Unable to allocate memory for private key data");
}